

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O0

int pt_evt_fetch_event(pt_event_decoder *decoder)

{
  int local_1c;
  int errcode;
  pt_event_decoder *decoder_local;
  
  if (decoder == (pt_event_decoder *)0x0) {
    decoder_local._4_4_ = -1;
  }
  else {
    do {
      local_1c = pt_evt_decode_packet(decoder);
      if (local_1c < 1) break;
      if (decoder->event != (pt_event *)0x0) {
        local_1c = -1;
        break;
      }
      decoder->field_0x72c = decoder->field_0x72c & 0xdf;
      local_1c = pt_evt_fetch_packet(decoder);
    } while (-1 < local_1c);
    decoder_local._4_4_ = local_1c;
  }
  return decoder_local._4_4_;
}

Assistant:

static int pt_evt_fetch_event(struct pt_event_decoder *decoder)
{
	int errcode;

	if (!decoder)
		return -pte_internal;

	for (;;) {
		errcode = pt_evt_decode_packet(decoder);
		if (errcode <= 0)
			break;

		if (decoder->event) {
			errcode = -pte_internal;
			break;
		}

		/* The packet decoder asked for a new packet without delivering
		 * an event.  That new packet isn't bound.
		 *
		 * All flows involving bound packets must take this path since
		 * returning with zero, e.g. via pt_evt_fetch_packet(), without
		 * an event will be diagnosed by our caller.
		 */
		decoder->bound = 0;

		errcode = pt_evt_fetch_packet(decoder);
		if (errcode < 0)
			break;
	}

	return errcode;
}